

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void reverse_iterator_suite::iterate_null(void)

{
  index_type *piVar1;
  bool bVar2;
  const_reverse_iterator local_138;
  undefined1 local_120 [8];
  const_reverse_iterator where_2;
  variable data_2;
  undefined1 local_c0 [8];
  const_reverse_iterator where_1;
  variable data_1;
  undefined1 local_50 [8];
  reverse_iterator where;
  variable data;
  
  piVar1 = &where.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((reverse_iterator *)local_50,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            ((reverse_iterator *)&data_1.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)local_50,
                          (reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                           *)&data_1.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9e1,"void reverse_iterator_suite::iterate_null()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)&data_1.storage.field_0x28);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
                     *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_1.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rbegin
            ((const_reverse_iterator *)local_c0,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::rend
            ((const_reverse_iterator *)&data_2.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_c0,
                          (reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)&data_2.storage.field_0x28);
  boost::detail::test_impl
            ("where == data.rend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9e6,"void reverse_iterator_suite::iterate_null()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)&data_2.storage.field_0x28);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_2.current.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::crbegin
            ((const_reverse_iterator *)local_120,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::crend
            (&local_138,
             (basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = std::operator==((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                           *)local_120,&local_138);
  boost::detail::test_impl
            ("where == data.crend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x9eb,"void reverse_iterator_suite::iterate_null()",bVar2);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator(&local_138);
  std::reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>::
  ~reverse_iterator((reverse_iterator<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator>
                     *)local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_2.current.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void iterate_null()
{
    {
        variable data;
        variable::reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        const variable data;
        variable::const_reverse_iterator where = data.rbegin();
        TRIAL_PROTOCOL_TEST(where == data.rend());
    }
    {
        variable data;
        variable::const_reverse_iterator where = data.crbegin();
        TRIAL_PROTOCOL_TEST(where == data.crend());
    }
}